

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreplay.h
# Opt level: O1

void ExpReplay::multipredict
               (expreplay *param_1,single_learner *base,example *ec,size_t count,size_t step,
               polyprediction *pred,bool finalize_predictions)

{
  uint64_t *puVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  size_t sVar5;
  size_t sVar6;
  
  lVar2 = *(long *)(base + 0x40);
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(base + 0xe0) * (int)count);
  if (lVar2 == 0) {
    if (step != 0) {
      sVar6 = step;
      do {
        (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
        if (finalize_predictions) {
          pfVar3 = (ec->pred).scalars._begin;
          pfVar4 = (ec->pred).scalars._end;
          sVar5 = (ec->pred).scalars.erase_count;
          (pred->scalars).end_array = (ec->pred).scalars.end_array;
          (pred->scalars).erase_count = sVar5;
          (pred->scalars)._begin = pfVar3;
          (pred->scalars)._end = pfVar4;
        }
        else {
          pred->scalar = ec->partial_prediction;
        }
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)*(uint *)(base + 0xe0);
        pred = pred + 1;
        sVar6 = sVar6 - 1;
      } while (sVar6 != 0);
    }
    count = step + count;
  }
  else {
    (**(code **)(base + 0x40))
              (*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec,step,
               *(undefined8 *)(base + 0xe0),pred,finalize_predictions);
  }
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 - (count * *(long *)(base + 0xe0) & 0xffffffff);
  return;
}

Assistant:

void multipredict(expreplay&, LEARNER::single_learner& base, example& ec, size_t count, size_t step,
    polyprediction* pred, bool finalize_predictions)
{
  base.multipredict(ec, count, step, pred, finalize_predictions);
}